

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy-sinksource.cc
# Opt level: O2

char * __thiscall
duckdb_snappy::UncheckedByteArraySink::GetAppendBufferVariable
          (UncheckedByteArraySink *this,size_t min_size,size_t desired_size_hint,char *scratch,
          size_t scratch_size,size_t *allocated_size)

{
  *allocated_size = desired_size_hint;
  return this->dest_;
}

Assistant:

char* UncheckedByteArraySink::GetAppendBufferVariable(
      size_t min_size, size_t desired_size_hint, char* scratch,
      size_t scratch_size, size_t* allocated_size) {
  // TODO: Switch to [[maybe_unused]] when we can assume C++17.
  (void)min_size;
  (void)scratch;
  (void)scratch_size;

  *allocated_size = desired_size_hint;
  return dest_;
}